

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

void __thiscall VmFunction::AddBlock(VmFunction *this,VmBlock *block)

{
  VmBlock **ppVVar1;
  VmBlock *pVVar2;
  VmBlock **ppVVar3;
  
  if (block == (VmBlock *)0x0) {
    __assert_fail("block",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x822,"void VmFunction::AddBlock(VmBlock *)");
  }
  if (block->parent != (VmFunction *)0x0) {
    __assert_fail("block->parent == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x823,"void VmFunction::AddBlock(VmBlock *)");
  }
  if (block->prevSibling != (VmBlock *)0x0) {
    __assert_fail("block->prevSibling == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x824,"void VmFunction::AddBlock(VmBlock *)");
  }
  if (block->nextSibling == (VmBlock *)0x0) {
    block->parent = this;
    ppVVar1 = &this->lastBlock;
    if (this->firstBlock == (VmBlock *)0x0) {
      ppVVar3 = &this->firstBlock;
      *ppVVar1 = block;
    }
    else {
      pVVar2 = *ppVVar1;
      pVVar2->nextSibling = block;
      block->prevSibling = pVVar2;
      ppVVar3 = ppVVar1;
    }
    *ppVVar3 = block;
    return;
  }
  __assert_fail("block->nextSibling == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x825,"void VmFunction::AddBlock(VmBlock *)");
}

Assistant:

void VmFunction::AddBlock(VmBlock* block)
{
	assert(block);
	assert(block->parent == NULL);
	assert(block->prevSibling == NULL);
	assert(block->nextSibling == NULL);

	block->parent = this;

	if(!firstBlock)
	{
		firstBlock = lastBlock = block;
	}
	else
	{
		lastBlock->nextSibling = block;
		block->prevSibling = lastBlock;
		lastBlock = block;
	}
}